

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaObjectBuilderPrivate::~QMetaObjectBuilderPrivate(QMetaObjectBuilderPrivate *this)

{
  vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_> *unaff_retaddr;
  
  QList<const_QMetaObject_*>::~QList((QList<const_QMetaObject_*> *)0x37a3c3);
  std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::~vector
            (unaff_retaddr);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x37a3e5);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x37a3f3);
  std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::~vector
            ((vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_> *)
             unaff_retaddr);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::~vector
            ((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *)
             unaff_retaddr);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::~vector
            ((vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_> *)
             unaff_retaddr);
  QByteArray::~QByteArray((QByteArray *)0x37a427);
  return;
}

Assistant:

QMetaObjectBuilderPrivate()
        : flags(0)
    {
        superClass = &QObject::staticMetaObject;
        staticMetacallFunction = nullptr;
    }